

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotDigitalEx<ImPlot::GetterXsYs<signed_char>>
               (char *label_id,GetterXsYs<signed_char> getter)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImPlotPlot *pIVar5;
  bool bVar6;
  ImU32 col;
  ImDrawList *pIVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ImPlotContext *pIVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined8 extraout_XMM0_Qb_00;
  float fVar16;
  ImVec2 pMax;
  ImPlotPoint itemData1;
  ImVec2 local_a8;
  ImVec2 local_a0;
  int local_94;
  ImPlotContext *local_90;
  ImPlotPoint local_88;
  ImPlotPoint local_78;
  ImRect *local_68;
  int local_5c;
  ImVec4 *local_58;
  ImDrawList *local_50;
  ulong local_48;
  ImPlotContext *local_40;
  ulong local_38;
  undefined8 extraout_XMM0_Qb;
  
  bVar6 = BeginItem(label_id,1);
  if (bVar6) {
    local_90 = GImPlot;
    pIVar7 = GetPlotDrawList();
    pIVar13 = GImPlot;
    if ((1 < getter.Count) && ((GImPlot->NextItemData).RenderFill == true)) {
      uVar11 = (ulong)(uint)getter.Offset;
      lVar14 = (long)getter.Stride;
      lVar8 = ((getter.Offset % getter.Count + getter.Count) % getter.Count) * lVar14;
      local_78.x = (double)(int)getter.Xs[lVar8];
      local_78.y = (double)(int)getter.Ys[lVar8];
      local_68 = local_90->PixelRange + GImPlot->CurrentPlot->CurrentYAxis;
      local_40 = GImPlot;
      local_58 = (GImPlot->NextItemData).Colors + 1;
      local_38 = (ulong)(getter.Offset + 1);
      iVar9 = 0;
      iVar12 = 0;
      local_50 = pIVar7;
      local_48 = uVar11;
      do {
        lVar8 = (((iVar12 + (int)uVar11) % getter.Count + getter.Count) % getter.Count) * lVar14;
        local_88.x = (double)(int)getter.Xs[lVar8];
        local_88.y = (double)(int)getter.Ys[lVar8];
        if ((ulong)ABS(local_78.y) < 0x7ff0000000000000) {
          fVar1 = (local_40->NextItemData).LineWeight;
          local_78.y = (double)(~-(ulong)(local_78.y <= 0.0) & (ulong)local_78.y);
          fVar2 = (local_40->NextItemData).DigitalBitHeight;
          fVar16 = (float)local_78.y * fVar2;
          local_5c = (int)fVar16;
          local_94 = (int)((float)(-(uint)(fVar16 <= fVar2) & (uint)fVar2 |
                                  ~-(uint)(fVar16 <= fVar2) & (uint)fVar16) +
                          (local_40->NextItemData).DigitalBitGap);
          if (local_94 < iVar9) {
            local_94 = iVar9;
          }
          local_a0 = PlotToPixels(&local_78,-1);
          auVar15._0_8_ = PlotToPixels(&local_88,-1);
          auVar15._8_8_ = extraout_XMM0_Qb;
          fVar16 = auVar15._0_4_;
          fVar2 = (local_68->Min).y;
          local_a0.y = (float)(-0x14 - local_90->DigitalPlotOffset) + fVar2;
          local_a8.y = (float)(-0x14 - ((int)fVar1 + local_90->DigitalPlotOffset + local_5c)) +
                       fVar2;
          local_a8.x = fVar16;
          iVar10 = iVar12 + 2;
          iVar9 = local_94;
          uVar11 = local_48;
          while (local_94 = iVar9, local_48 = uVar11, iVar10 < getter.Count) {
            fVar16 = auVar15._0_4_;
            if ((local_78.y != local_88.y) || (NAN(local_78.y) || NAN(local_88.y))) break;
            lVar8 = ((((int)local_38 + iVar12) % getter.Count + getter.Count) % getter.Count) *
                    lVar14;
            local_88.x = (double)(int)getter.Xs[lVar8];
            local_88.y = (double)(int)getter.Ys[lVar8];
            auVar15._0_8_ = PlotToPixels(&local_88,-1);
            auVar15._8_8_ = extraout_XMM0_Qb_00;
            fVar16 = auVar15._0_4_;
            local_a8.x = fVar16;
            iVar10 = iVar12 + 3;
            iVar12 = iVar12 + 1;
            iVar9 = local_94;
            uVar11 = local_48;
          }
          fVar1 = (local_68->Min).x;
          fVar2 = local_a0.x;
          if (local_a0.x < fVar1) {
            local_a0.x = fVar1;
            fVar2 = fVar1;
          }
          if (fVar16 < fVar1) {
            local_a8.x = fVar1;
            fVar16 = fVar1;
          }
          fVar1 = (local_68->Max).x;
          if (fVar1 < fVar2) {
            local_a0.x = fVar1;
            fVar2 = fVar1;
          }
          if (fVar1 < fVar16) {
            local_a8.x = fVar1;
            fVar16 = fVar1;
          }
          if (fVar2 < fVar16) {
            pIVar5 = local_90->CurrentPlot;
            fVar1 = (pIVar5->PlotRect).Min.x;
            if (((((fVar1 <= fVar2) && ((pIVar5->PlotRect).Min.y <= local_a0.y)) &&
                 (fVar2 < (pIVar5->PlotRect).Max.x)) && (local_a0.y < (pIVar5->PlotRect).Max.y)) ||
               (((fVar1 <= fVar16 && ((pIVar5->PlotRect).Min.y <= local_a8.y)) &&
                ((fVar16 < (pIVar5->PlotRect).Max.x && (local_a8.y < (pIVar5->PlotRect).Max.y))))))
            {
              col = ImGui::GetColorU32(local_58);
              ImDrawList::AddRectFilled(local_50,&local_a0,&local_a8,col,0.0,0xf);
              iVar9 = local_94;
            }
          }
        }
        pIVar13 = GImPlot;
        iVar12 = iVar12 + 1;
        local_78.x = local_88.x;
        local_78.y = local_88.y;
      } while (iVar12 < getter.Count);
      uVar3 = local_90->DigitalPlotItemCnt;
      uVar4 = local_90->DigitalPlotOffset;
      local_90->DigitalPlotItemCnt = uVar3 + 1;
      local_90->DigitalPlotOffset = iVar9 + uVar4;
    }
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar13->NextItemData);
    pIVar13->PreviousItem = pIVar13->CurrentItem;
    pIVar13->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotDigitalEx(const char* label_id, Getter getter) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        ImPlotContext& gp = *GImPlot;
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImPlotNextItemData& s = GetItemData();
        if (getter.Count > 1 && s.RenderFill) {
            const int y_axis = GetCurrentYAxis();
            int pixYMax = 0;
            ImPlotPoint itemData1 = getter(0);
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint itemData2 = getter(i);
                if (ImNanOrInf(itemData1.y)) {
                    itemData1 = itemData2;
                    continue;
                }
                if (ImNanOrInf(itemData2.y)) itemData2.y = ImConstrainNan(ImConstrainInf(itemData2.y));
                int pixY_0 = (int)(s.LineWeight);
                itemData1.y = ImMax(0.0, itemData1.y);
                float pixY_1_float = s.DigitalBitHeight * (float)itemData1.y;
                int pixY_1 = (int)(pixY_1_float); //allow only positive values
                int pixY_chPosOffset = (int)(ImMax(s.DigitalBitHeight, pixY_1_float) + s.DigitalBitGap);
                pixYMax = ImMax(pixYMax, pixY_chPosOffset);
                ImVec2 pMin = PlotToPixels(itemData1);
                ImVec2 pMax = PlotToPixels(itemData2);
                int pixY_Offset = 20; //20 pixel from bottom due to mouse cursor label
                pMin.y = (gp.PixelRange[y_axis].Min.y) + ((-gp.DigitalPlotOffset)                   - pixY_Offset);
                pMax.y = (gp.PixelRange[y_axis].Min.y) + ((-gp.DigitalPlotOffset) - pixY_0 - pixY_1 - pixY_Offset);
                //plot only one rectangle for same digital state
                while (((i+2) < getter.Count) && (itemData1.y == itemData2.y)) {
                    const int in = (i + 1);
                    itemData2 = getter(in);
                    if (ImNanOrInf(itemData2.y)) break;
                    pMax.x = PlotToPixels(itemData2).x;
                    i++;
                }
                //do not extend plot outside plot range
                if (pMin.x < gp.PixelRange[y_axis].Min.x) pMin.x = gp.PixelRange[y_axis].Min.x;
                if (pMax.x < gp.PixelRange[y_axis].Min.x) pMax.x = gp.PixelRange[y_axis].Min.x;
                if (pMin.x > gp.PixelRange[y_axis].Max.x) pMin.x = gp.PixelRange[y_axis].Max.x;
                if (pMax.x > gp.PixelRange[y_axis].Max.x) pMax.x = gp.PixelRange[y_axis].Max.x;
                //plot a rectangle that extends up to x2 with y1 height
                if ((pMax.x > pMin.x) && (gp.CurrentPlot->PlotRect.Contains(pMin) || gp.CurrentPlot->PlotRect.Contains(pMax))) {
                    // ImVec4 colAlpha = item->Color;
                    // colAlpha.w = item->Highlight ? 1.0f : 0.9f;
                    DrawList.AddRectFilled(pMin, pMax, ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]));
                }
                itemData1 = itemData2;
            }
            gp.DigitalPlotItemCnt++;
            gp.DigitalPlotOffset += pixYMax;
        }
        EndItem();
    }
}